

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O0

basic_string_view<char,_std::char_traits<char>_>
jessilib::string_view_cast<char,std::basic_string_view<char,std::char_traits<char>>>
          (basic_string_view<char,_std::char_traits<char>_> *in_string)

{
  const_pointer __str;
  size_type __len;
  basic_string_view<char,_std::char_traits<char>_> *in_string_local;
  
  __str = std::basic_string_view<char,_std::char_traits<char>_>::data(in_string);
  __len = std::basic_string_view<char,_std::char_traits<char>_>::size(in_string);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&in_string_local,__str,__len);
  return _in_string_local;
}

Assistant:

std::basic_string_view<OutCharT> string_view_cast(const InT& in_string) {
	using InCharT = typename impl_unicode::is_string<InT>::type;

	if constexpr (sizeof(InCharT) == sizeof(OutCharT)) {
		return { reinterpret_cast<const OutCharT*>(in_string.data()), in_string.size() };
	}
	else {
		size_t in_string_bytes = in_string.size() * sizeof(InCharT);
		if constexpr (sizeof(OutCharT) > sizeof(InCharT)) {
			// The output type is larger than the input type; verify no partial codepoints
			if (in_string_bytes % sizeof(OutCharT) != 0) {
				// This cannot be used to produce a valid result
				return {};
			}
		}

		size_t out_string_units = in_string_bytes / sizeof(OutCharT);
		const OutCharT* data_begin = reinterpret_cast<const OutCharT*>(in_string.data());
		return { data_begin, out_string_units };
	}
}